

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void expression_char(ch_compilation *comp)

{
  char *pcVar1;
  size_t sVar2;
  int *data_start;
  ch_op op_2;
  ch_op op_1;
  ch_op op;
  int local_24 [3];
  
  pcVar1 = (comp->previous).lexeme.start;
  sVar2 = (comp->previous).lexeme.size;
  local_24[2] = 0xf;
  ch_emit_write(&((comp->emit).emit_scope)->bytecode,local_24 + 2,1);
  if (sVar2 == 2) {
    data_start = local_24 + 1;
    local_24[1] = 0;
  }
  else {
    local_24[0] = (int)pcVar1[1];
    data_start = local_24;
  }
  ch_emit_write(&((comp->emit).emit_scope)->bytecode,data_start,1);
  return;
}

Assistant:

void expression_char(ch_compilation* comp) {
  ch_lexeme value = comp->previous.lexeme;
  
  EMIT_OP(GET_EMIT(comp), OP_CHAR);
  // 2 characters means the char expression is ''
  // In that case, we emit a null byte
  if (value.size == 2) {
      EMIT_OP(GET_EMIT(comp), 0);
      return;
  }

  EMIT_OP(GET_EMIT(comp), value.start[1]);
}